

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_BtFindBestMatch_dictMatchState_selectMLS
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iLimit,size_t *offsetPtr)

{
  uint mls;
  uint uVar1;
  size_t sVar2;
  BYTE *pBStack_30;
  
  uVar1 = (ms->cParams).minMatch;
  mls = uVar1 - 6;
  if (mls < 2) {
    if (ip < (ms->window).base + ms->nextToUpdate) {
      return 0;
    }
    pBStack_30 = (BYTE *)0x6;
  }
  else if (uVar1 == 5) {
    if (ip < (ms->window).base + ms->nextToUpdate) {
      return 0;
    }
    pBStack_30 = (BYTE *)0x5;
  }
  else {
    if (ip < (ms->window).base + ms->nextToUpdate) {
      return 0;
    }
    pBStack_30 = (BYTE *)0x4;
  }
  ZSTD_updateDUBT(ms,ip,pBStack_30,mls);
  sVar2 = ZSTD_DUBT_findBestMatch(ms,ip,iLimit,offsetPtr,(U32)pBStack_30,ZSTD_dictMatchState);
  return sVar2;
}

Assistant:

static size_t ZSTD_BtFindBestMatch_dictMatchState_selectMLS (
                        ZSTD_matchState_t* ms,
                        const BYTE* ip, const BYTE* const iLimit,
                        size_t* offsetPtr)
{
    switch(ms->cParams.minMatch)
    {
    default : /* includes case 3 */
    case 4 : return ZSTD_BtFindBestMatch(ms, ip, iLimit, offsetPtr, 4, ZSTD_dictMatchState);
    case 5 : return ZSTD_BtFindBestMatch(ms, ip, iLimit, offsetPtr, 5, ZSTD_dictMatchState);
    case 7 :
    case 6 : return ZSTD_BtFindBestMatch(ms, ip, iLimit, offsetPtr, 6, ZSTD_dictMatchState);
    }
}